

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O0

void MiniScript::UnitTest::RunAllTests(void)

{
  long *local_10;
  UnitTest *test;
  
  for (local_10 = cTests; local_10 != (long *)0x0; local_10 = (long *)local_10[2]) {
    (**(code **)(*local_10 + 8))();
    (**(code **)*local_10)();
    (**(code **)(*local_10 + 0x10))();
  }
  return;
}

Assistant:

void UnitTest::RunAllTests()
	{
		for (UnitTest *test = cTests; test; test = test->mNext) {
//			std::cout << "Running " << test->name << std::endl;
			test->SetUp();
			test->Run();
			test->TearDown();
//			std::cout << "StringStorage instances left: " << StringStorage::instanceCount << std::endl;
//			std::cout << "total RefCountedStorage instances left: " << RefCountedStorage::instanceCount << std::endl;
		}
	}